

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

void V_Constr(Vector *V,char *Name,size_t Dim,InstanceType Instance,Boolean OwnData)

{
  LASErrIdType LVar1;
  size_t sVar2;
  char *pcVar3;
  Real *pRVar4;
  Boolean OwnData_local;
  InstanceType Instance_local;
  size_t Dim_local;
  char *Name_local;
  Vector *V_local;
  
  sVar2 = strlen(Name);
  pcVar3 = (char *)malloc(sVar2 + 1);
  V->Name = pcVar3;
  if (V->Name == (char *)0x0) {
    LASError(LASMemAllocErr,"V_Constr",Name,(char *)0x0,(char *)0x0);
  }
  else {
    strcpy(V->Name,Name);
  }
  V->Dim = Dim;
  V->Instance = Instance;
  V->LockLevel = 0;
  V->Multipl = 1.0;
  V->OwnData = OwnData;
  if (OwnData != False) {
    LVar1 = LASResult();
    if (LVar1 == LASOK) {
      pRVar4 = (Real *)malloc((Dim + 1) * 8);
      V->Cmp = pRVar4;
      if (V->Cmp == (Real *)0x0) {
        LASError(LASMemAllocErr,"V_Constr",Name,(char *)0x0,(char *)0x0);
      }
    }
    else {
      V->Cmp = (Real *)0x0;
    }
  }
  return;
}

Assistant:

void V_Constr(Vector *V, char *Name, size_t Dim, InstanceType Instance,
              Boolean OwnData)
/* constructor of the type Vector */
{
    V->Name = (char *)malloc((strlen(Name) + 1) * sizeof(char));
    if (V->Name != NULL)
        strcpy(V->Name, Name);
    else
        LASError(LASMemAllocErr, "V_Constr", Name, NULL, NULL);
    V->Dim = Dim;
    V->Instance = Instance;
    V->LockLevel = 0;
    V->Multipl = 1.0;
    V->OwnData = OwnData;
    if (OwnData) {
        if (LASResult() == LASOK) {
            V->Cmp = (Real *)malloc((Dim + 1) * sizeof(Real));
            if (V->Cmp == NULL) 
                LASError(LASMemAllocErr, "V_Constr", Name, NULL, NULL);
        } else {
            V->Cmp = NULL;
        }
    }
}